

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.c
# Opt level: O0

void av1_save_all_coding_context(AV1_COMP *cpi)

{
  int iVar1;
  long in_RDI;
  AV1_COMP *in_stack_00000020;
  
  save_extra_coding_context(cpi);
  iVar1 = frame_is_intra_only((AV1_COMMON *)(in_RDI + 0x3bf80));
  if (iVar1 == 0) {
    release_scaled_references(in_stack_00000020);
  }
  return;
}

Assistant:

void av1_save_all_coding_context(AV1_COMP *cpi) {
  save_extra_coding_context(cpi);
  if (!frame_is_intra_only(&cpi->common)) release_scaled_references(cpi);
}